

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_YM2612PCM_Delay(VGMPlayer *this)

{
  uint uVar1;
  CHIP_DEVICE *cDev_00;
  size_type sVar2;
  reference pvVar3;
  UINT8 data;
  CHIP_DEVICE *cDev;
  VGMPlayer *this_local;
  
  cDev_00 = GetDevicePtr(this,'\x02','\0');
  this->_fileTick = (this->_fileData[this->_filePos] & 0xf) + this->_fileTick;
  if (((cDev_00 != (CHIP_DEVICE *)0x0) && (cDev_00->write8 != (DEVFUNC_WRITE_A8D8)0x0)) &&
     (uVar1 = this->_ym2612pcm_bnkPos,
     sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&this->_pcmBank[0].data), uVar1 < sVar2)) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_pcmBank[0].data,(ulong)this->_ym2612pcm_bnkPos);
    SendYMCommand(cDev_00,'\0','*',*pvVar3);
    this->_ym2612pcm_bnkPos = this->_ym2612pcm_bnkPos + 1;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_YM2612PCM_Delay(void)
{
	CHIP_DEVICE* cDev = GetDevicePtr(0x02, 0);
	_fileTick += (fData[0x00] & 0x0F);
	
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	if (_ym2612pcm_bnkPos >= _pcmBank[0].data.size())
		return;
	
	UINT8 data = _pcmBank[0].data[_ym2612pcm_bnkPos];
	SendYMCommand(cDev, 0x00, 0x2A, data);
	_ym2612pcm_bnkPos ++;
	// TODO: clip when exceeding pcmBank size
	
	return;
}